

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O3

bool operator<(COutPoint *a,COutPoint *b)

{
  long lVar1;
  weak_ordering wVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  wVar2 = std::__detail::_Synth3way::
          operator()<transaction_identifier<false>,_transaction_identifier<false>_>
                    ((_Synth3way *)&std::__detail::__synth3way,&a->hash,&b->hash);
  if ((wVar2._M_value == '\0') && (wVar2._M_value = -(a->n < b->n), a->n == b->n)) {
    wVar2._M_value = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)((byte)wVar2._M_value >> 7);
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const COutPoint& a, const COutPoint& b)
    {
        return std::tie(a.hash, a.n) < std::tie(b.hash, b.n);
    }